

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O1

bool cmExecProgramCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  _Alloc_hider _Var12;
  Encoding in_R9D;
  pointer pbVar13;
  bool bVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int iVar16;
  bool bVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string_view value_00;
  string command;
  string output_variable;
  string arguments;
  string coutput;
  string return_variable;
  int retVal;
  string output;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  cmExecutionStatus *local_1c8;
  string *local_1c0;
  string local_1b8;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_178;
  undefined8 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  long local_148;
  undefined1 *local_140;
  undefined8 local_138;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 == pbVar2) {
    local_178.first._M_len = (size_t)&local_178.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_178.first._M_len
        != &local_178.second) {
      operator_delete((void *)local_178.first._M_len,
                      (ulong)((long)&((local_178.second)->_M_dataplus)._M_p + 1));
    }
    bVar17 = false;
  }
  else {
    local_198 = &local_188;
    bVar17 = false;
    local_190 = 0;
    local_188 = 0;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_1c0 = (string *)&status->Error;
    bVar5 = false;
    iVar16 = 0;
    bVar6 = false;
    bVar14 = false;
    local_1c8 = status;
    do {
      iVar7 = std::__cxx11::string::compare((char *)pbVar13);
      if (iVar7 == 0) {
        bVar14 = true;
        bVar6 = false;
LAB_003ba451:
        iVar16 = iVar16 + 1;
        bVar3 = true;
        bVar5 = false;
      }
      else if (bVar14) {
        if (local_1b8._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&local_1b8);
          iVar16 = iVar16 + 1;
          bVar3 = true;
          bVar14 = false;
        }
        else {
          local_178.first._M_len = (size_t)&local_178.second;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"called with incorrect number of arguments","");
          std::__cxx11::string::_M_assign(local_1c0);
LAB_003ba405:
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              local_178.first._M_len != &local_178.second) {
            operator_delete((void *)local_178.first._M_len,
                            (ulong)((long)&((local_178.second)->_M_dataplus)._M_p + 1));
          }
          bVar3 = false;
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)pbVar13);
        if (iVar7 == 0) {
          bVar6 = true;
          bVar14 = false;
          goto LAB_003ba451;
        }
        if (bVar6) {
          if (local_108._M_string_length != 0) {
            local_178.first._M_len = (size_t)&local_178.second;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"called with incorrect number of arguments","");
            std::__cxx11::string::_M_assign(local_1c0);
            goto LAB_003ba405;
          }
          std::__cxx11::string::_M_assign((string *)&local_108);
          iVar16 = iVar16 + 1;
          bVar3 = true;
          bVar6 = false;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar13);
          if (iVar7 == 0) {
            iVar16 = iVar16 + 1;
            bVar3 = true;
            bVar14 = false;
            bVar6 = false;
            bVar5 = true;
          }
          else {
            bVar3 = true;
            if (bVar5) {
              std::__cxx11::string::_M_append((char *)&local_198,(ulong)(pbVar13->_M_dataplus)._M_p)
              ;
              std::__cxx11::string::append((char *)&local_198);
              iVar16 = iVar16 + 1;
            }
          }
        }
      }
      if (!bVar3) break;
      pbVar13 = pbVar13 + 1;
      bVar17 = pbVar13 == pbVar2;
    } while (!bVar17);
    if (bVar17) {
      local_1e8 = &local_1d8;
      local_1e0 = 0;
      local_1d8 = 0;
      if (local_190 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_1e8);
      }
      else {
        cmSystemTools::ConvertToRunCommandPath
                  (&local_c8,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        local_178.first._M_len = local_c8._M_string_length;
        local_178.first._M_str = local_c8._M_dataplus._M_p;
        local_158 = (undefined1 *)((long)&local_68.field_2 + 8);
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 1;
        local_68.field_2._M_local_buf[8] = ' ';
        local_160 = 1;
        local_150 = 0;
        local_148 = local_190;
        local_140 = local_198;
        local_138 = 0;
        views._M_len = 3;
        views._M_array = &local_178;
        local_178.second = &local_c8;
        local_68.field_2._M_allocated_capacity = (size_type)local_158;
        cmCatViews(&local_e8,views);
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(uint)local_e8._M_dataplus._M_p) !=
            &local_e8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_e8._M_dataplus._M_p._4_4_,(uint)local_e8._M_dataplus._M_p),
                          local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      sVar4 = local_1b8._M_string_length;
      local_e8._M_dataplus._M_p._0_4_ = 0;
      paVar1 = &local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5) - (long)iVar16 ==
          2) {
        cmsys::SystemTools::MakeDirectory(pbVar13 + 1,(mode_t *)0x0);
        paVar15 = &local_88.field_2;
        local_88._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,local_1e8,local_1e8 + local_1e0);
        bVar6 = anon_unknown.dwarf_12eba3a::RunCommand
                          (&local_88,&local_68,(int *)&local_e8,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar4 == 0
                           ,in_R9D);
        _Var12._M_p = local_88._M_dataplus._M_p;
      }
      else {
        paVar15 = &local_a8.field_2;
        local_a8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_1e8,local_1e8 + local_1e0);
        bVar6 = anon_unknown.dwarf_12eba3a::RunCommand
                          (&local_a8,&local_68,(int *)&local_e8,(char *)0x0,sVar4 == 0,in_R9D);
        _Var12._M_p = local_a8._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p != paVar15) {
        operator_delete(_Var12._M_p,paVar15->_M_allocated_capacity + 1);
      }
      if (bVar6 == false) {
        local_e8._M_dataplus._M_p._0_4_ = 0xffffffff;
      }
      if (local_1b8._M_string_length != 0) {
        uVar8 = std::__cxx11::string::find_first_not_of((char *)&local_68,0x8c96c4,0);
        lVar9 = std::__cxx11::string::find_last_not_of
                          ((char *)&local_68,0x8c96c4,0xffffffffffffffff);
        if (uVar8 == 0xffffffffffffffff) {
          uVar8 = 0;
        }
        lVar11 = local_68._M_string_length - 1;
        if (lVar9 != -1) {
          lVar11 = lVar9;
        }
        std::__cxx11::string::string
                  ((string *)&local_178,(string *)&local_68,uVar8,(lVar11 - uVar8) + 1);
        value._M_str = (char *)local_178.first._M_len;
        value._M_len = (size_t)local_178.first._M_str;
        cmMakefile::AddDefinition(local_1c8->Makefile,&local_1b8,value);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            local_178.first._M_len != &local_178.second) {
          operator_delete((void *)local_178.first._M_len,
                          (ulong)((long)&((local_178.second)->_M_dataplus)._M_p + 1));
        }
      }
      if (local_108._M_string_length != 0) {
        snprintf((char *)&local_178,100,"%d",(ulong)(uint)local_e8._M_dataplus._M_p);
        this = local_1c8->Makefile;
        sVar10 = strlen((char *)&local_178);
        value_00._M_str = (char *)&local_178;
        value_00._M_len = sVar10;
        cmMakefile::AddDefinition(this,&local_108,value_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,
                        (ulong)(local_68.field_2._M_allocated_capacity + 1));
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,
                      CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                               local_1b8.field_2._M_local_buf[0]) + 1);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
    }
  }
  return bVar17;
}

Assistant:

bool cmExecProgramCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmStrCat(cmSystemTools::ConvertToRunCommandPath(args[0]), ' ',
                       arguments);
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = RunCommand(command, output, retVal, args[1].c_str(), verbose);
  } else {
    result = RunCommand(command, output, retVal, nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    status.GetMakefile().AddDefinition(output_variable, coutput);
  }

  if (!return_variable.empty()) {
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%d", retVal);
    status.GetMakefile().AddDefinition(return_variable, buffer);
  }

  return true;
}